

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_bag<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> top_actions_last;
  reference ppeVar1;
  polyprediction *this;
  size_type sVar2;
  example *peVar3;
  action_score **ppaVar4;
  reference pvVar5;
  size_t sVar6;
  action_score *paVar7;
  size_type sVar8;
  action_score *paVar9;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  v_array<ACTION_SCORE::action_score> *in_RDI;
  float fVar10;
  size_t i_4;
  uint32_t i_3;
  uint32_t j;
  size_t i_2;
  size_t tied_actions;
  action_score e;
  action_score *__end3;
  action_score *__begin3;
  v_array<ACTION_SCORE::action_score> *__range3;
  uint32_t count;
  uint32_t i_1;
  bool test_sequence;
  vector<float,_std::allocator<float>_> *top_actions;
  uint32_t i;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  cb_explore_adf *in_stack_00000150;
  multi_ex *in_stack_00000430;
  vw *in_stack_fffffffffffffed8;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar11;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffef0;
  cb_explore_adf *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  uint32_t uVar12;
  undefined8 in_stack_ffffffffffffff20;
  ulong uVar13;
  score_iterator *in_stack_ffffffffffffff28;
  score_iterator *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffff40;
  multi_ex *in_stack_ffffffffffffff48;
  multi_learner *in_stack_ffffffffffffff50;
  uint local_80;
  uint local_7c;
  ulong local_78;
  float fStack_64;
  action_score *local_58;
  uint local_44;
  uint local_28;
  
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  this = &(*ppeVar1)->pred;
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if ((uint)sVar2 == 0) {
    v_array<ACTION_SCORE::action_score>::clear(in_stack_fffffffffffffee0);
  }
  else {
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x316d32);
    fStack_64 = in_stack_ffffffffffffff18;
    for (local_28 = 0; local_28 < (uint)sVar2; local_28 = local_28 + 1) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0,
                 (value_type_conflict3 *)in_stack_fffffffffffffed8);
    }
    std::vector<float,_std::allocator<float>_>::assign
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0,
               (size_type)in_stack_fffffffffffffed8,(value_type_conflict3 *)0x316dc3);
    peVar3 = test_adf_sequence(in_stack_00000430);
    for (local_44 = 0; (action_score *)(ulong)local_44 < in_RDI[3]._end; local_44 = local_44 + 1) {
      if ((((ulong)in_RDI[4].end_array & 1) == 0) || (local_44 != 0)) {
        uVar12 = BS::weight_gen(in_stack_fffffffffffffed8);
      }
      else {
        uVar12 = 1;
      }
      in_stack_ffffffffffffff1c = uVar12;
      if ((uVar12 == 0) || (peVar3 == (example *)0x0)) {
        LEARNER::multiline_learn_or_predict<false>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (uint64_t)in_stack_ffffffffffffff40._M_current,in_stack_ffffffffffffff3c);
      }
      else {
        LEARNER::multiline_learn_or_predict<true>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (uint64_t)in_stack_ffffffffffffff40._M_current,in_stack_ffffffffffffff3c);
      }
      ppaVar4 = v_array<ACTION_SCORE::action_score>::begin
                          ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
      local_58 = *ppaVar4;
      ppaVar4 = v_array<ACTION_SCORE::action_score>::end
                          ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
      paVar7 = *ppaVar4;
      for (; local_58 != paVar7; local_58 = local_58 + 1) {
        fStack_64 = (*local_58).score;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 1),
                            (ulong)*local_58 & 0xffffffff);
        *pvVar5 = fStack_64 + *pvVar5;
      }
      if (((ulong)in_RDI[4].end_array & 0x100) == 0) {
        sVar6 = fill_tied(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        for (local_78 = 0; local_78 < sVar6; local_78 = local_78 + 1) {
          in_stack_ffffffffffffff10 = (float)(long)sVar6;
          in_stack_ffffffffffffff14 = (float)sVar6;
          fVar10 = 1.0 / in_stack_ffffffffffffff14;
          paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                             ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_78);
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)&in_RDI[1].erase_count,
                              (ulong)paVar7->action);
          *pvVar5 = fVar10 + *pvVar5;
        }
      }
      else {
        in_stack_fffffffffffffef8 = (cb_explore_adf *)&in_RDI[1].erase_count;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,0);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef8,
                            (ulong)paVar7->action);
        *pvVar5 = *pvVar5 + 1.0;
      }
      if (peVar3 != (example *)0x0) {
        for (local_7c = 1; local_7c < uVar12; local_7c = local_7c + 1) {
          LEARNER::multiline_learn_or_predict<true>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (uint64_t)in_stack_ffffffffffffff40._M_current,in_stack_ffffffffffffff3c);
        }
      }
    }
    v_array<ACTION_SCORE::action_score>::clear(in_stack_fffffffffffffee0);
    local_80 = 0;
    while( true ) {
      uVar13 = (ulong)local_80;
      sVar8 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)(in_RDI + 1));
      if (sVar8 <= uVar13) break;
      v_array<ACTION_SCORE::action_score>::push_back
                (in_stack_fffffffffffffee0,(action_score *)in_stack_fffffffffffffed8);
      local_80 = local_80 + 1;
    }
    std::begin<std::vector<float,std::allocator<float>>>
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffed8);
    std::end<std::vector<float,std::allocator<float>>>
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffed8);
    ACTION_SCORE::begin_scores
              ((action_scores *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    ACTION_SCORE::end_scores
              ((action_scores *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    top_actions_last._M_current._4_4_ = in_stack_ffffffffffffff3c;
    top_actions_last._M_current._0_4_ = in_stack_ffffffffffffff38;
    exploration::
    generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
              (in_stack_ffffffffffffff40,top_actions_last,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
    uVar11 = *(undefined4 *)&in_RDI[3]._begin;
    ACTION_SCORE::begin_scores((action_scores *)CONCAT44(uVar11,in_stack_fffffffffffffee8));
    ACTION_SCORE::end_scores((action_scores *)CONCAT44(uVar11,in_stack_fffffffffffffee8));
    exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              ((float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff20 >> 0x18,0),
               (score_iterator *)CONCAT44(in_stack_ffffffffffffff1c,fStack_64),
               (score_iterator *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    do_sort(in_stack_00000150);
    for (uVar13 = 0; uVar13 < (sVar2 & 0xffffffff); uVar13 = uVar13 + 1) {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](in_RDI,uVar13);
      paVar9 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,uVar13);
      *paVar9 = *paVar7;
    }
  }
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}